

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

TokenOrSyntax * __thiscall
slang::syntax::PortReferenceSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,PortReferenceSyntax *this,size_t index)

{
  Info *pIVar1;
  
  if (index == 1) {
    *(ElementSelectSyntax **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         this->select;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\x01';
  }
  else if (index == 0) {
    pIVar1 = (this->name).info;
    *(undefined8 *)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         *(undefined8 *)&this->name;
    *(Info **)((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
                      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                      .
                      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
              + 8) = pIVar1;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\0';
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax PortReferenceSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return name;
        case 1: return select;
        default: return nullptr;
    }
}